

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.cpp
# Opt level: O2

Float pbrt::Turbulence(Point3f p,Vector3f dpdx,Vector3f dpdy,Float omega,int maxOctaves)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int i;
  uint uVar6;
  int iVar7;
  undefined4 in_register_0000003c;
  uint uVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  float fVar19;
  undefined1 auVar20 [16];
  float in_XMM2_Dd;
  float fVar21;
  undefined1 auVar22 [64];
  float in_XMM4_Dd;
  undefined1 in_register_00001344 [12];
  undefined1 in_register_000013c4 [12];
  Point3f p_00;
  Point3f p_01;
  undefined1 local_48 [16];
  undefined4 local_38;
  undefined4 uStack_34;
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  auVar22._4_60_ = dpdx._12_60_;
  auVar22._0_4_ = dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar12._0_4_ =
       dpdx.super_Tuple3<pbrt::Vector3,_float>.x * dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar12._4_4_ =
       dpdx.super_Tuple3<pbrt::Vector3,_float>.y * dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar12._8_4_ = 0;
  auVar12._12_4_ = in_XMM2_Dd * in_XMM2_Dd;
  auVar20._0_4_ =
       dpdy.super_Tuple3<pbrt::Vector3,_float>.x * dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar20._4_4_ =
       dpdy.super_Tuple3<pbrt::Vector3,_float>.y * dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar20._8_4_ = 0;
  auVar20._12_4_ = in_XMM4_Dd * in_XMM4_Dd;
  auVar10 = vhaddps_avx(auVar12,auVar20);
  auVar1._4_12_ = in_register_00001344;
  auVar1._0_4_ = dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar1 = vinsertps_avx(auVar22._0_16_,auVar1,0x10);
  auVar10 = vshufps_avx(auVar10,auVar10,0xe8);
  auVar13._0_4_ = auVar1._0_4_ * auVar1._0_4_ + auVar10._0_4_;
  auVar13._4_4_ = auVar1._4_4_ * auVar1._4_4_ + auVar10._4_4_;
  auVar13._8_4_ = auVar1._8_4_ * auVar1._8_4_ + auVar10._8_4_;
  auVar13._12_4_ = auVar1._12_4_ * auVar1._12_4_ + auVar10._12_4_;
  auVar10 = vmovshdup_avx(auVar13);
  auVar10 = vmaxss_avx(auVar10,auVar13);
  iVar7 = maxOctaves;
  auVar16._0_4_ = Log2(auVar10._0_4_);
  auVar16._4_60_ = extraout_var;
  auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf000000),0),auVar16._0_16_,ZEXT416(0xbf800000));
  auVar14._0_4_ = (float)maxOctaves;
  auVar14._4_12_ = in_register_000013c4;
  auVar10 = vminss_avx(auVar14,auVar1);
  uVar2 = vcmpss_avx512f(auVar1,ZEXT816(0) << 0x40,1);
  fVar21 = 1.0;
  local_48 = ZEXT816(0);
  fVar3 = (float)((uint)!(bool)((byte)uVar2 & 1) * auVar10._0_4_);
  auVar10._0_4_ = fVar3;
  auVar10 = vroundss_avx(auVar10,auVar10,9);
  uVar6 = (uint)auVar10._0_4_;
  uVar8 = ~((int)uVar6 >> 0x1f) & uVar6;
  fVar19 = fVar21;
  while( true ) {
    bVar9 = uVar8 == 0;
    uVar8 = uVar8 - 1;
    local_38 = p.super_Tuple3<pbrt::Point3,_float>.x;
    uStack_34 = p.super_Tuple3<pbrt::Point3,_float>.y;
    if (bVar9) break;
    p_00.super_Tuple3<pbrt::Point3,_float>.x = fVar21 * local_38;
    p_00.super_Tuple3<pbrt::Point3,_float>.y = fVar21 * uStack_34;
    p_00.super_Tuple3<pbrt::Point3,_float>.z = fVar21 * p.super_Tuple3<pbrt::Point3,_float>.z;
    auVar17._0_4_ = Noise((pbrt *)CONCAT44(in_register_0000003c,iVar7),p_00);
    auVar17._4_60_ = extraout_var_00;
    auVar4._8_4_ = 0x7fffffff;
    auVar4._0_8_ = 0x7fffffff7fffffff;
    auVar4._12_4_ = 0x7fffffff;
    auVar10 = vandps_avx512vl(auVar17._0_16_,auVar4);
    fVar21 = fVar21 * 1.99;
    local_48 = vfmadd231ss_fma(local_48,ZEXT416((uint)fVar19),auVar10);
    fVar19 = fVar19 * omega;
  }
  auVar15._0_4_ = ((fVar3 - (float)(int)uVar6) + -0.3) / 0.39999998;
  auVar15._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar10 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar15);
  uVar2 = vcmpss_avx512f(auVar15,ZEXT816(0) << 0x40,1);
  fVar3 = (float)((uint)!(bool)((byte)uVar2 & 1) * auVar10._0_4_);
  auVar11._4_12_ = auVar10._4_12_;
  auVar11._0_4_ = fVar3;
  auVar10 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar11,ZEXT416(0x40400000));
  fVar3 = fVar3 * fVar3 * auVar10._0_4_;
  p_01.super_Tuple3<pbrt::Point3,_float>.x = fVar21 * local_38;
  p_01.super_Tuple3<pbrt::Point3,_float>.y = fVar21 * uStack_34;
  p_01.super_Tuple3<pbrt::Point3,_float>.z = fVar21 * p.super_Tuple3<pbrt::Point3,_float>.z;
  auVar18._0_4_ = Noise((pbrt *)CONCAT44(in_register_0000003c,iVar7),p_01);
  auVar18._4_60_ = extraout_var_01;
  auVar5._8_4_ = 0x7fffffff;
  auVar5._0_8_ = 0x7fffffff7fffffff;
  auVar5._12_4_ = 0x7fffffff;
  auVar10 = vandps_avx512vl(auVar18._0_16_,auVar5);
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * auVar10._0_4_)),ZEXT416((uint)(1.0 - fVar3)),
                            ZEXT416(0x3e4ccccd));
  auVar10 = vfmadd213ss_fma(auVar10,ZEXT416((uint)fVar19),ZEXT416((uint)local_48._0_4_));
  for (; (int)uVar6 < maxOctaves; uVar6 = uVar6 + 1) {
    auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)fVar19),SUB6416(ZEXT464(0x3e4ccccd),0));
    fVar19 = fVar19 * omega;
  }
  return auVar10._0_4_;
}

Assistant:

Float Turbulence(Point3f p, Vector3f dpdx, Vector3f dpdy, Float omega, int maxOctaves) {
    // Compute number of octaves for antialiased FBm
    Float len2 = std::max(LengthSquared(dpdx), LengthSquared(dpdy));
    Float n = Clamp(-1 - .5f * Log2(len2), 0, maxOctaves);
    int nInt = std::floor(n);

    // Compute sum of octaves of noise for turbulence
    Float sum = 0, lambda = 1, o = 1;
    for (int i = 0; i < nInt; ++i) {
        sum += o * std::abs(Noise(lambda * p));
        lambda *= 1.99f;
        o *= omega;
    }

    // Account for contributions of clamped octaves in turbulence
    Float nPartial = n - nInt;
    sum += o * Lerp(SmoothStep(nPartial, .3f, .7f), 0.2, std::abs(Noise(lambda * p)));
    for (int i = nInt; i < maxOctaves; ++i) {
        sum += o * 0.2f;
        o *= omega;
    }

    return sum;
}